

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetAddressByHash_Test::TestBody(AddressFactory_GetAddressByHash_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  AddressFactory factory;
  Address *in_stack_fffffffffffff9a8;
  undefined6 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  AddressType *in_stack_fffffffffffff9b8;
  allocator *paVar4;
  undefined6 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c6;
  undefined1 in_stack_fffffffffffff9c7;
  char *in_stack_fffffffffffff9c8;
  AssertHelper local_610;
  Message local_608 [2];
  ByteData local_5f8;
  undefined1 local_5e0 [383];
  byte local_461;
  ConstCharPtr local_460;
  AssertHelper local_458;
  Message local_450 [2];
  allocator local_439;
  string local_438 [32];
  ByteData local_418;
  undefined1 local_400 [383];
  byte local_281;
  ConstCharPtr local_280;
  AssertHelper local_278;
  Message local_270;
  undefined4 local_268;
  AddressType local_264;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248 [4];
  string local_228 [32];
  AssertionResult local_208 [2];
  allocator local_1e1;
  string local_1e0 [32];
  ByteData local_1c0;
  Address local_1a8 [376];
  AddressFactory local_30;
  
  cfd::AddressFactory::AddressFactory(&local_30,kRegtest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_1e1);
  cfd::core::ByteData::ByteData(&local_1c0,local_1e0);
  cfd::AddressFactory::GetAddressByHash((AddressType)local_1a8,(ByteData *)&local_30);
  cfd::core::ByteData::~ByteData((ByteData *)0x1862b6);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  cfd::core::Address::GetHash(in_stack_fffffffffffff9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",pcVar3,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string(local_228);
  cfd::core::ByteData::~ByteData((ByteData *)0x18634c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x186474);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message((Message *)0x1864d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x186529);
  local_264 = cfd::core::Address::GetAddressType(local_1a8);
  local_268 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_fffffffffffff9c8,
             (char *)CONCAT17(in_stack_fffffffffffff9c7,
                              CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
             in_stack_fffffffffffff9b8,
             (AddressType *)
             CONCAT17(in_stack_fffffffffffff9b7,
                      CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1865e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x186645);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18669d);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_280,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_280);
  if (bVar1) {
    local_281 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      paVar4 = &local_439;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_438,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",paVar4);
      cfd::core::ByteData::ByteData(&local_418,local_438);
      cfd::AddressFactory::GetAddressByHash((AddressType)local_400,(ByteData *)&local_30);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff9b7,
                          CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)));
      cfd::core::ByteData::~ByteData((ByteData *)0x186775);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
    }
    if ((local_281 & 1) == 0) {
      local_280.value =
           "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData(\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001868ad;
    }
  }
  else {
LAB_001868ad:
    testing::Message::Message(local_450);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xde,local_280.value);
    testing::internal::AssertHelper::operator=(&local_458,local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message((Message *)0x186915);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_460,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_460);
  if ((bool)uVar2) {
    local_461 = 0;
    in_stack_fffffffffffff9b6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff9b6) {
      cfd::core::ByteData::ByteData(&local_5f8);
      cfd::AddressFactory::GetAddressByHash((AddressType)local_5e0,(ByteData *)&local_30);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)));
      cfd::core::ByteData::~ByteData((ByteData *)0x1869f4);
    }
    if ((local_461 & 1) != 0) goto LAB_00186b4c;
    local_460.value =
         "Expected: factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_608);
  testing::internal::AssertHelper::AssertHelper
            (&local_610,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xdf,local_460.value);
  testing::internal::AssertHelper::operator=(&local_610,local_608);
  testing::internal::AssertHelper::~AssertHelper(&local_610);
  testing::Message::~Message((Message *)0x186b0a);
LAB_00186b4c:
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x186b66);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByHash)
{
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd")), CfdException);
    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData()), CfdException);
  }
}